

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O0

ASN1_GENERALIZEDTIME * ASN1_TIME_to_generalizedtime(ASN1_TIME *t,ASN1_GENERALIZEDTIME **out)

{
  char *dst;
  int iVar1;
  size_t dst_size;
  size_t out_str_capacity;
  char *out_str;
  ASN1_GENERALIZEDTIME *ret;
  ASN1_GENERALIZEDTIME **out_local;
  ASN1_TIME *in_local;
  
  iVar1 = ASN1_TIME_check(t);
  if (iVar1 == 0) {
    return (ASN1_GENERALIZEDTIME *)0x0;
  }
  if ((out == (ASN1_GENERALIZEDTIME **)0x0) || (*out == (ASN1_GENERALIZEDTIME *)0x0)) {
    out_str = (char *)ASN1_GENERALIZEDTIME_new();
    if ((ASN1_GENERALIZEDTIME *)out_str == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_002c2d9c;
  }
  else {
    out_str = (char *)*out;
  }
  if (t->type == 0x18) {
    iVar1 = ASN1_STRING_set((ASN1_STRING *)out_str,t->data,(long)t->length);
    if (iVar1 != 0) {
LAB_002c2d76:
      if ((out != (ASN1_GENERALIZEDTIME **)0x0) && (*out == (ASN1_GENERALIZEDTIME *)0x0)) {
        *out = (ASN1_GENERALIZEDTIME *)out_str;
      }
      return (ASN1_GENERALIZEDTIME *)out_str;
    }
  }
  else {
    iVar1 = ASN1_STRING_set((ASN1_STRING *)out_str,(void *)0x0,(long)(t->length + 2));
    if (iVar1 != 0) {
      dst = *(char **)(out_str + 8);
      dst_size = (size_t)(t->length + 3);
      if (*t->data < 0x35) {
        OPENSSL_strlcpy(dst,"20",dst_size);
      }
      else {
        OPENSSL_strlcpy(dst,"19",dst_size);
      }
      OPENSSL_strlcat(dst,(char *)t->data,dst_size);
      goto LAB_002c2d76;
    }
  }
LAB_002c2d9c:
  if ((out == (ASN1_GENERALIZEDTIME **)0x0) || (*out != (ASN1_GENERALIZEDTIME *)out_str)) {
    ASN1_GENERALIZEDTIME_free((ASN1_GENERALIZEDTIME *)out_str);
  }
  return (ASN1_GENERALIZEDTIME *)0x0;
}

Assistant:

ASN1_GENERALIZEDTIME *ASN1_TIME_to_generalizedtime(const ASN1_TIME *in,
                                                   ASN1_GENERALIZEDTIME **out) {
  if (!ASN1_TIME_check(in)) {
    return NULL;
  }

  ASN1_GENERALIZEDTIME *ret = NULL;
  if (!out || !*out) {
    if (!(ret = ASN1_GENERALIZEDTIME_new())) {
      goto err;
    }
  } else {
    ret = *out;
  }

  // If already GeneralizedTime just copy across
  if (in->type == V_ASN1_GENERALIZEDTIME) {
    if (!ASN1_STRING_set(ret, in->data, in->length)) {
      goto err;
    }
    goto done;
  }

  // Grow the string to accomodate the two-digit century.
  if (!ASN1_STRING_set(ret, NULL, in->length + 2)) {
    goto err;
  }

  {
    char *const out_str = (char *)ret->data;
    // |ASN1_STRING_set| also allocates an additional byte for a trailing NUL.
    const size_t out_str_capacity = in->length + 2 + 1;
    // Work out the century and prepend
    if (in->data[0] >= '5') {
      OPENSSL_strlcpy(out_str, "19", out_str_capacity);
    } else {
      OPENSSL_strlcpy(out_str, "20", out_str_capacity);
    }
    OPENSSL_strlcat(out_str, (const char *)in->data, out_str_capacity);
  }

done:
  if (out != NULL && *out == NULL) {
    *out = ret;
  }
  return ret;

err:
  if (out == NULL || *out != ret) {
    ASN1_GENERALIZEDTIME_free(ret);
  }
  return NULL;
}